

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zzz_monster_test.h
# Opt level: O1

int zzz_MyGame_Example_Any_union_verifier(flatcc_union_verifier_descriptor_t *ud)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = ud->type - 1;
  if (bVar1 < 4) {
    iVar2 = flatcc_verify_union_table
                      (ud,(flatcc_table_verifier_f *)
                          (&PTR_zzz_MyGame_Example_Monster_verify_table_0010edd8)[bVar1]);
    return iVar2;
  }
  return 0;
}

Assistant:

static int zzz_MyGame_Example_Any_union_verifier(flatcc_union_verifier_descriptor_t *ud)
{
    switch (ud->type) {
    case 1: return flatcc_verify_union_table(ud, zzz_MyGame_Example_Monster_verify_table); /* Monster */
    case 2: return flatcc_verify_union_table(ud, zzz_MyGame_Example_TestSimpleTableWithEnum_verify_table); /* TestSimpleTableWithEnum */
    case 3: return flatcc_verify_union_table(ud, zzz_MyGame_Example2_Monster_verify_table); /* Monster2 */
    case 4: return flatcc_verify_union_table(ud, zzz_MyGame_Example_Alt_verify_table); /* Alt */
    default: return flatcc_verify_ok;
    }
}